

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfusableMatcher.cpp
# Opt level: O3

void __thiscall
ConfusableMatcher::GetKeyMappings(ConfusableMatcher *this,string *In,StackVector<CMString> *Output)

{
  byte bVar1;
  size_t __n;
  dense_hashtable<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>,_char,_std::hash<char>,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SelectKey,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SetKey,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>
  *pdVar2;
  CMString In_00;
  int iVar3;
  undefined1 *puVar4;
  pointer pCVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  pointer ppVar9;
  pointer ppVar10;
  long *plVar11;
  iterator valueIterator;
  StackVector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  mappingsStorage;
  dense_hashtable_iterator<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>,_char,_std::hash<char>,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SelectKey,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SetKey,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>
  local_1088;
  vector<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
  *local_1070;
  dense_hashtable_iterator<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>,_char,_std::hash<char>,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SelectKey,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SetKey,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>
  local_1068;
  undefined4 local_1050;
  undefined1 local_1018 [4032];
  long local_58 [2];
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_48;
  
  puVar4 = local_1018;
  local_1050 = 0;
  lVar6 = 0x1000;
  do {
    *(undefined1 **)(puVar4 + -0x30) = puVar4 + -0x20;
    *(undefined8 *)(puVar4 + -0x28) = 0;
    puVar4[-0x20] = 0;
    *(undefined1 **)(puVar4 + -0x10) = puVar4;
    *(undefined8 *)(puVar4 + -8) = 0;
    *puVar4 = 0;
    puVar4 = puVar4 + 0x40;
    lVar6 = lVar6 + -0x40;
  } while (lVar6 != 0);
  local_48.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (In->_M_string_length == 0) {
    __assert_fail("In.size() >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/TETYYS[P]ConfusableMatcher/ConfusableMatcher.cpp"
                  ,0x7b,
                  "void ConfusableMatcher::GetKeyMappings(std::string, StackVector<CMString> &)");
  }
  bVar1 = *(In->_M_dataplus)._M_p;
  ppVar9 = this->TheMap[bVar1].
           super__Vector_base<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar10 = this->TheMap[bVar1].
            super__Vector_base<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar9 != ppVar10) {
    local_1070 = this->TheMap + bVar1;
    do {
      __n = (ppVar9->first).Len;
      if (__n <= In->_M_string_length) {
        if (__n != 0) {
          iVar3 = bcmp((ppVar9->first).Str,(In->_M_dataplus)._M_p,__n);
          if (iVar3 != 0) goto LAB_00156f48;
        }
        pdVar2 = &ppVar9->second->rep;
        local_1088.pos = pdVar2->table;
        local_1088.end = local_1088.pos + pdVar2->num_buckets;
        local_1088.ht = pdVar2;
        google::
        dense_hashtable_iterator<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>,_char,_std::hash<char>,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SelectKey,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SetKey,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>
        ::advance_past_empty_and_deleted(&local_1088);
        while( true ) {
          local_1068.pos = pdVar2->table + pdVar2->num_buckets;
          local_1068.ht = pdVar2;
          local_1068.end = local_1068.pos;
          google::
          dense_hashtable_iterator<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>,_char,_std::hash<char>,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SelectKey,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SetKey,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>
          ::advance_past_empty_and_deleted(&local_1068);
          if (local_1088.pos == local_1068.pos) break;
          pCVar5 = ((local_1088.pos)->second->
                   super__Vector_base<CMString,_std::allocator<CMString>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          if (((local_1088.pos)->second->super__Vector_base<CMString,_std::allocator<CMString>_>).
              _M_impl.super__Vector_impl_data._M_finish != pCVar5) {
            lVar6 = 0;
            uVar8 = 0;
            do {
              In_00.Hash = *(size_t *)((long)&pCVar5->Hash + lVar6);
              In_00._0_16_ = *(undefined1 (*) [16])((long)&pCVar5->Str + lVar6);
              StackVector<CMString>::Push(Output,In_00);
              uVar8 = uVar8 + 1;
              pCVar5 = ((local_1088.pos)->second->
                       super__Vector_base<CMString,_std::allocator<CMString>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              uVar7 = ((long)((local_1088.pos)->second->
                             super__Vector_base<CMString,_std::allocator<CMString>_>)._M_impl.
                             super__Vector_impl_data._M_finish - (long)pCVar5 >> 3) *
                      -0x5555555555555555;
              lVar6 = lVar6 + 0x18;
            } while (uVar8 <= uVar7 && uVar7 - uVar8 != 0);
          }
          google::
          dense_hashtable_iterator<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>,_char,_std::hash<char>,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SelectKey,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SetKey,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>
          ::operator++(&local_1088);
        }
        ppVar10 = (local_1070->
                  super__Vector_base<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
      }
LAB_00156f48:
      ppVar9 = ppVar9 + 1;
    } while (ppVar9 != ppVar10);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_48);
  lVar6 = -0x1000;
  plVar11 = local_58;
  do {
    if (plVar11 != (long *)plVar11[-2]) {
      operator_delete((long *)plVar11[-2],*plVar11 + 1);
    }
    if (plVar11 + -4 != (long *)plVar11[-6]) {
      operator_delete((long *)plVar11[-6],plVar11[-4] + 1);
    }
    plVar11 = plVar11 + -8;
    lVar6 = lVar6 + 0x40;
  } while (lVar6 != 0);
  return;
}

Assistant:

void ConfusableMatcher::GetKeyMappings(std::string In, StackVector<CMString> &Output)
{
	StackVector<std::pair<std::string, std::string>> mappingsStorage;

	assert(In.size() >= 1);

	// Find array of whole keys
	auto &keyArr = TheMap[(unsigned char)In[0]];

	for (auto keyIterator = keyArr.begin();keyIterator != keyArr.end();keyIterator++) {
		if (keyIterator->first.Len > In.size() || (keyIterator->first).View() != CMStringView(In.data(), keyIterator->first.Len))
			continue;

		// Whole key found, return value array
		auto values = keyIterator->second;

		for (auto valueIterator = values->begin();valueIterator != values->end();valueIterator++) {
			for (auto x = 0;x < valueIterator->second->size();x++)
				Output.Push((*(valueIterator->second))[x]);
		}
	}
}